

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

void __thiscall
QRhiPassResourceTracker::registerTexture
          (QRhiPassResourceTracker *this,QRhiTexture *tex,TextureAccess *access,TextureStage *stage,
          UsageState *state)

{
  TextureAccess TVar1;
  TextureStage TVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Entry *pEVar5;
  Data<QHashPrivate::Node<QRhiTexture_*,_QRhiPassResourceTracker::Texture>_> *pDVar6;
  Span *pSVar7;
  ulong uVar8;
  Entry *pEVar9;
  char *pcVar10;
  TextureStage TVar11;
  uint uVar12;
  long in_FS_OFFSET;
  iterator iVar13;
  Texture local_78;
  undefined4 local_64;
  char *local_60;
  QArrayDataPointer<char> local_58;
  QRhiTexture *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = tex;
  iVar13 = QHash<QRhiTexture*,QRhiPassResourceTracker::Texture>::findImpl<QRhiTexture*>
                     ((QHash<QRhiTexture*,QRhiPassResourceTracker::Texture> *)&this->m_textures,
                      &local_40);
  pDVar6 = iVar13.i.d;
  if (pDVar6 == (Data<QHashPrivate::Node<QRhiTexture_*,_QRhiPassResourceTracker::Texture>_> *)0x0 &&
      iVar13.i.bucket == 0) {
    local_78.access = *access;
    local_78.stage = *stage;
    uVar3 = state->layout;
    uVar4 = state->access;
    local_78.stateAtPassBegin.stage = state->stage;
    local_78.stateAtPassBegin.layout = uVar3;
    local_78.stateAtPassBegin.access = uVar4;
    QHash<QRhiTexture*,QRhiPassResourceTracker::Texture>::
    emplace<QRhiPassResourceTracker::Texture_const&>
              ((QHash<QRhiTexture*,QRhiPassResourceTracker::Texture> *)&this->m_textures,&local_40,
               &local_78);
  }
  else {
    pSVar7 = pDVar6->spans;
    uVar8 = iVar13.i.bucket >> 7;
    uVar12 = (uint)iVar13.i.bucket & 0x7f;
    pEVar9 = pSVar7[uVar8].entries;
    TVar1 = *(TextureAccess *)(pEVar9[pSVar7[uVar8].offsets[uVar12]].storage.data + 8);
    if (TVar1 != *access) {
      if ((TVar1 - TexStorageLoad < 3) && (*access - TexStorageLoad < 3)) {
        pEVar5 = pEVar9 + pSVar7[uVar8].offsets[uVar12];
        (pEVar5->storage).data[8] = '\x05';
        (pEVar5->storage).data[9] = '\0';
        (pEVar5->storage).data[10] = '\0';
        (pEVar5->storage).data[0xb] = '\0';
        *access = *(TextureAccess *)(pEVar9[pSVar7[uVar8].offsets[uVar12]].storage.data + 8);
      }
      else {
        local_58.d = (local_40->super_QRhiResource).m_objectName.d.d;
        local_58.ptr = (local_40->super_QRhiResource).m_objectName.d.ptr;
        local_58.size = (local_40->super_QRhiResource).m_objectName.d.size;
        if (local_58.d != (Data *)0x0) {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_78.access = TexDepthOutput;
        local_64 = 0;
        local_78.stage = TexVertexStage;
        local_78.stateAtPassBegin.layout = 0;
        local_78.stateAtPassBegin.access = 0;
        local_78.stateAtPassBegin.stage = 0;
        local_60 = "default";
        pcVar10 = local_58.ptr;
        if (local_58.ptr == (char *)0x0) {
          pcVar10 = (char *)&QByteArray::_empty;
        }
        QMessageLogger::warning
                  ((char *)&local_78,
                   "Texture %p (%s) used with different accesses within the same pass, this is not allowed."
                   ,local_40,pcVar10);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
        pSVar7 = pDVar6->spans;
        pEVar9 = pSVar7[uVar8].entries;
      }
    }
    TVar2 = *(TextureStage *)(pEVar9[pSVar7[uVar8].offsets[uVar12]].storage.data + 0xc);
    TVar11 = *stage;
    if (TVar2 != TVar11) {
      if ((int)TVar2 < (int)TVar11) {
        TVar11 = TVar2;
      }
      *(TextureStage *)(pEVar9[pSVar7[uVar8].offsets[uVar12]].storage.data + 0xc) = TVar11;
      *stage = *(TextureStage *)(pEVar9[pSVar7[uVar8].offsets[uVar12]].storage.data + 0xc);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiPassResourceTracker::registerTexture(QRhiTexture *tex, TextureAccess *access, TextureStage *stage,
                                              const UsageState &state)
{
    auto it = m_textures.find(tex);
    if (it != m_textures.end()) {
        if (it->access != *access) {
            // Different subresources of a texture may be used for both load
            // and store in the same pass. (think reading from one mip level
            // and writing to another one in a compute shader) This we can
            // handle by treating the entire resource as read-write.
            if (isImageLoadStore(it->access) && isImageLoadStore(*access)) {
                it->access = QRhiPassResourceTracker::TexStorageLoadStore;
                *access = it->access;
            } else {
                const QByteArray name = tex->name();
                qWarning("Texture %p (%s) used with different accesses within the same pass, this is not allowed.",
                         tex, name.constData());
            }
        }
        if (it->stage != *stage) {
            it->stage = earlierStage(it->stage, *stage);
            *stage = it->stage;
        }
        return;
    }

    Texture t;
    t.access = *access;
    t.stage = *stage;
    t.stateAtPassBegin = state; // first use -> initial state
    m_textures.insert(tex, t);
}